

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIff.c
# Opt level: O2

int Gia_IffObjCount(Gia_Man_t *pGia,int iObj,int iFaninSkip2,int iFaninSkip3)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  int local_34;
  
  Gia_ManIncrementTravId(pGia);
  lVar4 = 0;
  local_34 = 0;
  while( true ) {
    iVar1 = Gia_ObjLutSize(pGia,iObj);
    if (iVar1 <= lVar4) break;
    piVar3 = Gia_ObjLutFanins(pGia,iObj);
    iVar1 = piVar3[lVar4];
    if (iVar1 != iFaninSkip3 && iVar1 != iFaninSkip2) {
      iVar2 = Gia_ObjIsTravIdCurrentId(pGia,iVar1);
      if (iVar2 == 0) {
        Gia_ObjSetTravIdCurrentId(pGia,iVar1);
        local_34 = local_34 + 1;
      }
    }
    lVar4 = lVar4 + 1;
  }
  if (-1 < iFaninSkip2) {
    lVar4 = 0;
    while( true ) {
      iVar1 = Gia_ObjLutSize(pGia,iFaninSkip2);
      if (iVar1 <= lVar4) break;
      piVar3 = Gia_ObjLutFanins(pGia,iFaninSkip2);
      iVar1 = piVar3[lVar4];
      if (iVar1 != iFaninSkip3) {
        iVar2 = Gia_ObjIsTravIdCurrentId(pGia,iVar1);
        if (iVar2 == 0) {
          Gia_ObjSetTravIdCurrentId(pGia,iVar1);
          local_34 = local_34 + 1;
        }
      }
      lVar4 = lVar4 + 1;
    }
  }
  if (-1 < iFaninSkip3) {
    lVar4 = 0;
    while( true ) {
      iVar1 = Gia_ObjLutSize(pGia,iFaninSkip3);
      if (iVar1 <= lVar4) break;
      piVar3 = Gia_ObjLutFanins(pGia,iFaninSkip3);
      iVar1 = piVar3[lVar4];
      if (iVar1 != iFaninSkip2) {
        iVar2 = Gia_ObjIsTravIdCurrentId(pGia,iVar1);
        if (iVar2 == 0) {
          Gia_ObjSetTravIdCurrentId(pGia,iVar1);
          local_34 = local_34 + 1;
        }
      }
      lVar4 = lVar4 + 1;
    }
  }
  return local_34;
}

Assistant:

int Gia_IffObjCount( Gia_Man_t * pGia, int iObj, int iFaninSkip2, int iFaninSkip3 )
{
    int i, iFanin, Count = 0;
    Gia_ManIncrementTravId( pGia );
    Gia_LutForEachFanin( pGia, iObj, iFanin, i )
    {
        if ( iFanin == iFaninSkip2 || iFanin == iFaninSkip3 )
            continue;
        if ( Gia_ObjIsTravIdCurrentId( pGia, iFanin ) )
            continue;
        Gia_ObjSetTravIdCurrentId( pGia, iFanin );
        Count++;
    }
    if ( iFaninSkip2 >= 0 )
    {
        Gia_LutForEachFanin( pGia, iFaninSkip2, iFanin, i )
        {
            if ( iFanin == iFaninSkip3 )
                continue;
            if ( Gia_ObjIsTravIdCurrentId( pGia, iFanin ) )
                continue;
            Gia_ObjSetTravIdCurrentId( pGia, iFanin );
            Count++;
        }
    }
    if ( iFaninSkip3 >= 0 )
    {
        Gia_LutForEachFanin( pGia, iFaninSkip3, iFanin, i )
        {
            if ( iFanin == iFaninSkip2 )
                continue;
            if ( Gia_ObjIsTravIdCurrentId( pGia, iFanin ) )
                continue;
            Gia_ObjSetTravIdCurrentId( pGia, iFanin );
            Count++;
        }
    }
    return Count;
}